

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O0

size_t __thiscall
andres::View<short,_false,_std::allocator<unsigned_long>_>::dimension
          (View<short,_false,_std::allocator<unsigned_long>_> *this)

{
  size_t sVar1;
  View<short,_false,_std::allocator<unsigned_long>_> *this_local;
  
  marray_detail::Assert<bool>(this->data_ != (pointer)0x0);
  sVar1 = marray_detail::Geometry<std::allocator<unsigned_long>_>::dimension(&this->geometry_);
  return sVar1;
}

Assistant:

inline const std::size_t
View<T, isConst, A>::dimension() const
{
    marray_detail::Assert(MARRAY_NO_DEBUG || this->data_ != 0);
    return geometry_.dimension();
}